

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O2

size_t __thiscall
andres::graph::
ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>
           *this,Graph *graph,
          SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *mask)

{
  pointer pEVar1;
  bool bVar2;
  size_t edge;
  ulong i;
  long lVar3;
  
  Partition<unsigned_long>::assign
            ((Partition<unsigned_long> *)this,
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  lVar3 = 8;
  for (i = 0; i < (ulong)((long)(graph->edges_).
                                super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(graph->edges_).
                                super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); i = i + 1) {
    bVar2 = lineage::ProblemGraph::
            SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::edge(mask,i);
    if (bVar2) {
      pEVar1 = (graph->edges_).
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      Partition<unsigned_long>::merge
                ((Partition<unsigned_long> *)this,
                 *(Index *)((long)pEVar1->vertexIndices_ + lVar3 + -8),
                 *(Index *)((long)pEVar1->vertexIndices_ + lVar3));
    }
    lVar3 = lVar3 + 0x10;
  }
  return *(size_t *)(this + 0x30);
}

Assistant:

inline std::size_t
ComponentsByPartition<GRAPH>::build(
    const Graph& graph,
    const SUBGRAPH_MASK& mask
) {
    partition_.assign(graph.numberOfVertices());
    for(std::size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {
        if(mask.edge(edge)) {
            const std::size_t v0 = graph.vertexOfEdge(edge, 0);
            const std::size_t v1 = graph.vertexOfEdge(edge, 1);
            if(mask.vertex(v0) && mask.vertex(v1)) {
                partition_.merge(v0, v1);
            }
        }
    }
    return partition_.numberOfSets();
}